

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O0

array<unsigned_char,_6UL> __thiscall ixy::IxgbeDevice::get_mac_addr(IxgbeDevice *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined4 local_24;
  uint32_t high;
  uint32_t low;
  IxgbeDevice *this_local;
  
  uVar1 = get_reg32(this,0x5400);
  uVar2 = get_reg32(this,0x5404);
  local_24 = uVar2 & 0xffff;
  return (_Type)((uint6)uVar1 | (uint6)local_24 << 0x20);
}

Assistant:

auto IxgbeDevice::get_mac_addr() -> std::array<uint8_t, 6> {
    auto low = get_reg32(IXGBE_RAL(0));
    auto high = get_reg32(IXGBE_RAH(0));

    return {
            static_cast<uint8_t>(low),
            static_cast<uint8_t>(low >> 8u),
            static_cast<uint8_t>(low >> 16u),
            static_cast<uint8_t>(low >> 24u),
            static_cast<uint8_t>(high),
            static_cast<uint8_t>(high >> 8u),
    };
}